

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

void __thiscall QHttpMultiPartPrivate::QHttpMultiPartPrivate(QHttpMultiPartPrivate *this)

{
  QRandomGenerator *this_00;
  QObjectPrivate *in_RDI;
  QObjectPrivate *data;
  long in_FS_OFFSET;
  quint32 random [6];
  undefined4 in_stack_ffffffffffffff18;
  Base64Option in_stack_ffffffffffffff1c;
  undefined8 *size;
  undefined1 local_78 [80];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QHttpMultiPartPrivate_0049dce0;
  QList<QHttpPart>::QList((QList<QHttpPart> *)0x2e3f0d);
  data = in_RDI + 0x90;
  QByteArray::QByteArray((QByteArray *)0x2e3f23);
  *(undefined4 *)(in_RDI + 0xa8) = 0;
  this_00 = (QRandomGenerator *)operator_new(0x40);
  QHttpMultiPartIODevice::QHttpMultiPartIODevice
            ((QHttpMultiPartIODevice *)this_00,
             (QHttpMultiPartPrivate *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
  ;
  *(QRandomGenerator **)(in_RDI + 0xb0) = this_00;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  uStack_20 = 0xaaaaaaaaaaaaaaaa;
  QRandomGenerator::global();
  size = &local_28;
  QRandomGenerator::fillRange<unsigned_int,_6UL,_true>
            (this_00,(uint (*) [6])CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QByteArray::fromRawData((char *)data,(qsizetype)size);
  QFlags<QByteArray::Base64Option>::QFlags
            ((QFlags<QByteArray::Base64Option> *)this_00,in_stack_ffffffffffffff1c);
  QByteArray::toBase64((QFlags_conflict *)local_78);
  ::operator+((char (*) [16])in_RDI,(QByteArray *)this_00);
  ::QStringBuilder::operator_cast_to_QByteArray
            ((QStringBuilder<const_char_(&)[16],_QByteArray> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QByteArray::operator=
            ((QByteArray *)this_00,
             (QByteArray *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  QByteArray::~QByteArray((QByteArray *)0x2e4025);
  QStringBuilder<const_char_(&)[16],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[16],_QByteArray> *)0x2e402f);
  QByteArray::~QByteArray((QByteArray *)0x2e4039);
  QByteArray::~QByteArray((QByteArray *)0x2e4043);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpMultiPartPrivate::QHttpMultiPartPrivate() : contentType(QHttpMultiPart::MixedType), device(new QHttpMultiPartIODevice(this))
{
    // 24 random bytes, becomes 32 characters when encoded to Base64
    quint32 random[6];
    QRandomGenerator::global()->fillRange(random);
    boundary = "boundary_.oOo._"
               + QByteArray::fromRawData(reinterpret_cast<char *>(random), sizeof(random)).toBase64();

    // boundary must not be longer than 70 characters, see RFC 2046, section 5.1.1
    Q_ASSERT(boundary.size() <= 70);
}